

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceNextGenBase.hpp
# Opt level: O2

void __thiscall
Diligent::
RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
::DestroyCommandQueues
          (RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
           *this)

{
  CommandQueue *pCVar1;
  IMemoryAllocator *pIVar2;
  size_type sVar3;
  long lVar4;
  ulong uVar5;
  string msg;
  string local_50;
  
  if (this->m_CommandQueues != (CommandQueue *)0x0) {
    lVar4 = 0;
    for (uVar5 = 0; uVar5 < this->m_CmdQueueCount; uVar5 = uVar5 + 1) {
      pCVar1 = this->m_CommandQueues;
      sVar3 = std::
              deque<std::pair<unsigned_long,_Diligent::DynamicStaleResourceWrapper>,_Diligent::STDAllocator<std::pair<unsigned_long,_Diligent::DynamicStaleResourceWrapper>,_Diligent::IMemoryAllocator>_>
              ::size((deque<std::pair<unsigned_long,_Diligent::DynamicStaleResourceWrapper>,_Diligent::STDAllocator<std::pair<unsigned_long,_Diligent::DynamicStaleResourceWrapper>,_Diligent::IMemoryAllocator>_>
                      *)((long)&(pCVar1->ReleaseQueue).m_StaleResources.
                                super__Deque_base<std::pair<unsigned_long,_Diligent::DynamicStaleResourceWrapper>,_Diligent::STDAllocator<std::pair<unsigned_long,_Diligent::DynamicStaleResourceWrapper>,_Diligent::IMemoryAllocator>_>
                                ._M_impl.super__Tp_alloc_type.m_Allocator + lVar4));
      if (sVar3 != 0) {
        FormatString<char[71]>
                  (&local_50,
                   (char (*) [71])
                   "All stale resources must be released before destroying a command queue");
        DebugAssertionFailed
                  (local_50._M_dataplus._M_p,"DestroyCommandQueues",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineNextGenBase/include/RenderDeviceNextGenBase.hpp"
                   ,0x124);
        std::__cxx11::string::~string((string *)&local_50);
      }
      sVar3 = std::
              deque<std::pair<unsigned_long,_Diligent::DynamicStaleResourceWrapper>,_Diligent::STDAllocator<std::pair<unsigned_long,_Diligent::DynamicStaleResourceWrapper>,_Diligent::IMemoryAllocator>_>
              ::size((deque<std::pair<unsigned_long,_Diligent::DynamicStaleResourceWrapper>,_Diligent::STDAllocator<std::pair<unsigned_long,_Diligent::DynamicStaleResourceWrapper>,_Diligent::IMemoryAllocator>_>
                      *)((long)&(pCVar1->ReleaseQueue).m_ReleaseQueue.
                                super__Deque_base<std::pair<unsigned_long,_Diligent::DynamicStaleResourceWrapper>,_Diligent::STDAllocator<std::pair<unsigned_long,_Diligent::DynamicStaleResourceWrapper>,_Diligent::IMemoryAllocator>_>
                                ._M_impl.super__Tp_alloc_type.m_Allocator + lVar4));
      if (sVar3 != 0) {
        FormatString<char[65]>
                  (&local_50,
                   (char (*) [65])"All resources must be released before destroying a command queue"
                  );
        DebugAssertionFailed
                  (local_50._M_dataplus._M_p,"DestroyCommandQueues",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineNextGenBase/include/RenderDeviceNextGenBase.hpp"
                   ,0x125);
        std::__cxx11::string::~string((string *)&local_50);
      }
      CommandQueue::~CommandQueue
                ((CommandQueue *)((long)&(pCVar1->Mtx).super___mutex_base._M_mutex + lVar4));
      lVar4 = lVar4 + 0x168;
    }
    pIVar2 = (this->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_RawMemAllocator;
    (*pIVar2->_vptr_IMemoryAllocator[1])(pIVar2,this->m_CommandQueues);
    this->m_CommandQueues = (CommandQueue *)0x0;
  }
  return;
}

Assistant:

void DestroyCommandQueues()
    {
        if (m_CommandQueues != nullptr)
        {
            for (size_t q = 0; q < m_CmdQueueCount; ++q)
            {
                auto& Queue = m_CommandQueues[q];
                DEV_CHECK_ERR(Queue.ReleaseQueue.GetStaleResourceCount() == 0, "All stale resources must be released before destroying a command queue");
                DEV_CHECK_ERR(Queue.ReleaseQueue.GetPendingReleaseResourceCount() == 0, "All resources must be released before destroying a command queue");
                Queue.~CommandQueue();
            }
            this->m_RawMemAllocator.Free(m_CommandQueues);
            m_CommandQueues = nullptr;
        }
    }